

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall
chrono::ChMarker::ChMarker
          (ChMarker *this,string *name,ChBody *body,ChCoordsys<double> *rel_pos,
          ChCoordsys<double> *rel_pos_dt,ChCoordsys<double> *rel_pos_dtdt)

{
  ChFrameMoving<double> *this_00;
  double dVar1;
  ChQuaternion<double> local_78;
  ChVector<double> local_58;
  ChCoordsys<double> *local_40;
  ChCoordsys<double> *local_38;
  
  local_40 = rel_pos_dtdt;
  local_38 = rel_pos_dt;
  ChObj::ChObj(&this->super_ChObj);
  this_00 = &this->super_ChFrameMoving<double>;
  local_78.m_data[0] = (double)&DAT_3ff0000000000000;
  local_58.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(this_00,&local_58,&local_78);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_0114ef10;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_0114ef50;
  (this->rest_coord).pos.m_data[0] = 0.0;
  (this->rest_coord).pos.m_data[1] = 0.0;
  (this->rest_coord).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->rest_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord_dt).rot.m_data[0] = 1.0;
  (this->last_rel_coord_dt).rot.m_data[1] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[2] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[3] = 0.0;
  local_78.m_data[0] = (double)&DAT_3ff0000000000000;
  local_58.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->abs_frame,&local_58,&local_78);
  std::__cxx11::string::_M_assign((string *)&(this->super_ChObj).m_name);
  this->Body = body;
  local_58.m_data[0] = (double)((ulong)local_58.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_78);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_X,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.m_data + 1));
  local_58.m_data[0] = (double)((ulong)local_58.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_78);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_Y,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.m_data + 1));
  local_58.m_data[0] = (double)((ulong)local_58.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_78);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_Z,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.m_data + 1));
  local_58.m_data[0] = (double)((ulong)local_58.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_78);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_ang,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.m_data + 1));
  dVar1 = DAT_011dd428;
  if (this != (ChMarker *)&DAT_011dd2a8) {
    (this->motion_axis).m_data[0] = VECT_Z;
    (this->motion_axis).m_data[1] = dVar1;
    (this->motion_axis).m_data[2] = DAT_011dd430;
  }
  ChCoordsys<double>::operator=(&this->rest_coord,(ChCoordsys<double> *)CSYSNORM);
  this->motion_type = M_MOTION_FUNCTIONS;
  ChFrame<double>::SetCoord(&this_00->super_ChFrame<double>,rel_pos);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[6])(this_00,local_38);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[0xb])(this_00,local_40);
  ChCoordsys<double>::operator=(&this->last_rel_coord,(ChCoordsys<double> *)CSYSNORM);
  ChCoordsys<double>::operator=(&this->last_rel_coord_dt,(ChCoordsys<double> *)CSYSNULL);
  this->last_time = 0.0;
  UpdateState(this);
  return;
}

Assistant:

ChMarker::ChMarker(const std::string& name,
                   ChBody* body,
                   const ChCoordsys<>& rel_pos,
                   const ChCoordsys<>& rel_pos_dt,
                   const ChCoordsys<>& rel_pos_dtdt) {
    SetNameString(name);
    Body = body;

    motion_X = chrono_types::make_shared<ChFunction_Const>(0);  // default: no motion
    motion_Y = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_Z = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_ang = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_axis = VECT_Z;

    rest_coord = CSYSNORM;

    motion_type = M_MOTION_FUNCTIONS;

    SetCoord(rel_pos);
    SetCoord_dt(rel_pos_dt);
    SetCoord_dtdt(rel_pos_dtdt);

    last_rel_coord = CSYSNORM;
    last_rel_coord_dt = CSYSNULL;
    last_time = 0;

    UpdateState();
}